

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSender.cpp
# Opt level: O0

void __thiscall unixsocketipc::MessageSender::MessageSender(MessageSender *this)

{
  MessageSender *this_local;
  
  this->_vptr_MessageSender = (_func_int **)&PTR__MessageSender_00104da8;
  std::__cxx11::string::string((string *)&this->socket_filename);
  this->server_socket_fd = 0;
  std::mutex::mutex(&this->mtx);
  return;
}

Assistant:

MessageSender::MessageSender() {
}